

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void NULLC::AutoArraySet(NULLCRef x,uint pos,NULLCAutoArray *arr)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  NULLCAutoArray local_38;
  
  if (arr == (NULLCAutoArray *)0x0) {
    nullcThrowError("ERROR: null pointer access");
    return;
  }
  if (x.typeID == arr->typeID) {
    if (*(uint *)(linker + 0x20c) <= x.typeID) {
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x7f,
                    "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
                   );
    }
    uVar1 = *(uint *)(*(long *)(linker + 0x200) + 4 + (ulong)x.typeID * 0x50);
    uVar4 = arr->len;
    if (uVar4 <= pos) {
      uVar4 = uVar4 + (uVar4 >> 1) + 1;
      if (uVar4 <= pos) {
        uVar4 = pos;
      }
      AutoArray(&local_38,x.typeID,uVar4);
      if ((void *)CONCAT44(local_38.ptr._4_4_,local_38.ptr._0_4_) == (void *)0x0) {
        return;
      }
      memcpy((void *)CONCAT44(local_38.ptr._4_4_,local_38.ptr._0_4_),arr->ptr,
             (ulong)(arr->len * uVar1));
      *(ulong *)arr = CONCAT44(local_38.ptr._0_4_,local_38.typeID);
      *(ulong *)((long)&arr->ptr + 4) = CONCAT44(local_38.len,local_38.ptr._4_4_);
    }
    memcpy(arr->ptr + pos * uVar1,x.ptr,(ulong)uVar1);
    return;
  }
  pcVar2 = nullcGetTypeName(x.typeID);
  pcVar3 = nullcGetTypeName(arr->typeID);
  nullcThrowError("ERROR: cannot convert from \'%s\' to an \'auto[]\' element type \'%s\'",pcVar2,
                  pcVar3);
  return;
}

Assistant:

void NULLC::AutoArraySet(NULLCRef x, unsigned pos, NULLCAutoArray* arr)
{
	if(!arr)
	{
		nullcThrowError("ERROR: null pointer access");
		return;
	}
	if(x.typeID != arr->typeID)
	{
		nullcThrowError("ERROR: cannot convert from '%s' to an 'auto[]' element type '%s'", nullcGetTypeName(x.typeID), nullcGetTypeName(arr->typeID));
		return;
	}

	unsigned elemSize = linker->exTypes[arr->typeID].size;
	if(pos >= arr->len)
	{
		unsigned newSize = 1 + arr->len + (arr->len >> 1);
		if(pos >= newSize)
			newSize = pos;
		NULLCAutoArray n;
		AutoArray(&n, arr->typeID, newSize);
		if(!n.ptr)
			return;
		memcpy(n.ptr, arr->ptr, unsigned(arr->len * elemSize));
		*arr = n;
	}
	memcpy(arr->ptr + elemSize * pos, x.ptr, elemSize);
}